

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleGlobCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool recurse)

{
  pointer pbVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  PolicyStatus PVar8;
  char *pcVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  ulong extraout_RDX;
  ulong uVar11;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  string *__lhs;
  string *inexpr;
  string *__lhs_00;
  pointer pMVar12;
  string expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  GlobMessages globMessages;
  string output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  Glob g;
  string variable;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    __assert_fail("args.size() > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmFileCommand.cxx"
                  ,0x2f0,
                  "bool cmFileCommand::HandleGlobCommand(const std::vector<std::string> &, bool)");
  }
  std::__cxx11::string::string((string *)&variable,(string *)(pbVar1 + 1));
  cmsys::Glob::Glob(&g);
  g.Recurse = recurse;
  PVar8 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0009);
  uVar11 = extraout_RDX;
  if (PVar8 < (REQUIRED_ALWAYS|WARN) && recurse) {
    uVar11 = 0x101L >> ((char)PVar8 * '\b' & 0x3fU);
    g.RecurseThroughSymlinks = SUB81(uVar11,0);
  }
  __lhs_00 = pbVar1 + 2;
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  bVar5 = true;
  bVar7 = false;
  do {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (__lhs_00 == pbVar1) {
      if (((recurse) && (PVar8 < NEW && !bVar7)) && (g.FollowedSymlinkCount != 0)) {
        pcVar2 = (this->super_cmCommand).Makefile;
        cmPolicies::GetPolicyWarning_abi_cxx11_(&expr,(cmPolicies *)0x9,(PolicyID)uVar11);
        cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&expr);
        std::__cxx11::string::~string((string *)&expr);
      }
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&variable,output._M_dataplus._M_p);
LAB_002dd42b:
      std::__cxx11::string::~string((string *)&output);
      cmsys::Glob::~Glob(&g);
      std::__cxx11::string::~string((string *)&variable);
      return __lhs_00 == pbVar1;
    }
    bVar6 = std::operator==(__lhs_00,"LIST_DIRECTORIES");
    if (bVar6) {
      __lhs = __lhs_00 + 1;
      if (__lhs == (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string
                  ((string *)&expr,"LIST_DIRECTORIES missing bool value.",(allocator *)&local_138);
        cmCommand::SetError(&this->super_cmCommand,&expr);
LAB_002dd421:
        std::__cxx11::string::~string((string *)&expr);
        goto LAB_002dd42b;
      }
      bVar6 = cmSystemTools::IsOn((__lhs->_M_dataplus)._M_p);
      uVar11 = extraout_RDX_00;
      bVar3 = true;
      bVar4 = true;
      if (!bVar6) {
        bVar6 = cmSystemTools::IsOff((__lhs->_M_dataplus)._M_p);
        if (!bVar6) {
          std::__cxx11::string::string
                    ((string *)&expr,"LIST_DIRECTORIES missing bool value.",(allocator *)&local_138)
          ;
          cmCommand::SetError(&this->super_cmCommand,&expr);
          goto LAB_002dd421;
        }
        uVar11 = extraout_RDX_01;
        bVar3 = false;
        bVar4 = false;
      }
    }
    else {
      __lhs = __lhs_00;
      if ((recurse) && (bVar6 = std::operator==(__lhs_00,"FOLLOW_SYMLINKS"), bVar6)) {
        g.RecurseThroughSymlinks = true;
        bVar7 = true;
        __lhs = __lhs_00 + 1;
        if (__lhs_00 + 1 ==
            (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string
                    ((string *)&expr,"GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS"
                     ,(allocator *)&local_138);
          cmCommand::SetError(&this->super_cmCommand,&expr);
          goto LAB_002dd421;
        }
      }
      bVar6 = std::operator==(__lhs,"RELATIVE");
      if (bVar6) {
        if (__lhs + 1 ==
            (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string
                    ((string *)&expr,"GLOB requires a directory after the RELATIVE tag",
                     (allocator *)&local_138);
          cmCommand::SetError(&this->super_cmCommand,&expr);
        }
        else {
          cmsys::Glob::SetRelative(&g,__lhs[1]._M_dataplus._M_p);
          __lhs = __lhs + 2;
          if (__lhs != (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish) goto LAB_002dd063;
          std::__cxx11::string::string
                    ((string *)&expr,"GLOB requires a glob expression after the directory",
                     (allocator *)&local_138);
          cmCommand::SetError(&this->super_cmCommand,&expr);
        }
        goto LAB_002dd421;
      }
LAB_002dd063:
      globMessages.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      globMessages.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      globMessages.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar6 = cmsys::SystemTools::FileIsFullPath((__lhs->_M_dataplus)._M_p);
      if (bVar6) {
        cmsys::Glob::FindFiles(&g,__lhs,&globMessages);
      }
      else {
        pcVar9 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
        std::__cxx11::string::string((string *)&expr,pcVar9,(allocator *)&local_138);
        inexpr = __lhs;
        if (expr._M_string_length != 0) {
          std::operator+(&local_138,"/",__lhs);
          inexpr = &expr;
          std::__cxx11::string::append((string *)inexpr);
          std::__cxx11::string::~string((string *)&local_138);
        }
        cmsys::Glob::FindFiles(&g,inexpr,&globMessages);
        std::__cxx11::string::~string((string *)&expr);
      }
      if (globMessages.
          super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>._M_impl.
          super__Vector_impl_data._M_start ==
          globMessages.
          super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_002dd236:
        pvVar10 = cmsys::Glob::GetFiles_abi_cxx11_(&g);
        std::
        __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  ((pvVar10->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
                   (pvVar10->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish);
        for (uVar11 = 0;
            uVar11 < (ulong)((long)(pvVar10->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pvVar10->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar11 = uVar11 + 1) {
          if (!bVar5) {
            std::__cxx11::string::append((char *)&output);
          }
          std::__cxx11::string::append((string *)&output);
          bVar5 = false;
        }
        bVar6 = true;
      }
      else {
        bVar6 = false;
        for (pMVar12 = globMessages.
                       super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pMVar12 !=
            globMessages.
            super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>._M_impl.
            super__Vector_impl_data._M_finish; pMVar12 = pMVar12 + 1) {
          pcVar2 = (this->super_cmCommand).Makefile;
          if (pMVar12->type == cyclicRecursion) {
            std::operator+(&local_c8,"Cyclic recursion detected while globbing for \'",__lhs);
            std::operator+(&local_138,&local_c8,"\':\n");
            std::operator+(&expr,&local_138,&pMVar12->content);
            cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&expr);
            std::__cxx11::string::~string((string *)&expr);
            std::__cxx11::string::~string((string *)&local_138);
            std::__cxx11::string::~string((string *)&local_c8);
          }
          else {
            std::operator+(&local_c8,"Error has occurred while globbing for \'",__lhs);
            std::operator+(&local_138,&local_c8,"\' - ");
            std::operator+(&expr,&local_138,&pMVar12->content);
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&expr);
            std::__cxx11::string::~string((string *)&expr);
            std::__cxx11::string::~string((string *)&local_138);
            std::__cxx11::string::~string((string *)&local_c8);
            bVar6 = true;
          }
        }
        if (!bVar6) goto LAB_002dd236;
        bVar6 = false;
      }
      std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::~vector
                (&globMessages);
      uVar11 = extraout_RDX_02;
      bVar3 = g.ListDirs;
      bVar4 = g.RecurseListDirs;
      if (!bVar6) goto LAB_002dd42b;
    }
    g.RecurseListDirs = bVar4;
    g.ListDirs = bVar3;
    __lhs_00 = __lhs + 1;
  } while( true );
}

Assistant:

bool cmFileCommand::HandleGlobCommand(std::vector<std::string> const& args,
                                      bool recurse)
{
  // File commands has at least one argument
  assert(args.size() > 1);

  std::vector<std::string>::const_iterator i = args.begin();

  i++; // Get rid of subcommand

  std::string variable = *i;
  i++;
  cmsys::Glob g;
  g.SetRecurse(recurse);

  bool explicitFollowSymlinks = false;
  cmPolicies::PolicyStatus status =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0009);
  if (recurse) {
    switch (status) {
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        g.RecurseThroughSymlinksOff();
        break;
      case cmPolicies::OLD:
      case cmPolicies::WARN:
        g.RecurseThroughSymlinksOn();
        break;
    }
  }

  std::string output;
  bool first = true;
  for (; i != args.end(); ++i) {
    if (*i == "LIST_DIRECTORIES") {
      ++i;
      if (i != args.end()) {
        if (cmSystemTools::IsOn(i->c_str())) {
          g.SetListDirs(true);
          g.SetRecurseListDirs(true);
        } else if (cmSystemTools::IsOff(i->c_str())) {
          g.SetListDirs(false);
          g.SetRecurseListDirs(false);
        } else {
          this->SetError("LIST_DIRECTORIES missing bool value.");
          return false;
        }
      } else {
        this->SetError("LIST_DIRECTORIES missing bool value.");
        return false;
      }
      continue;
    }

    if (recurse && (*i == "FOLLOW_SYMLINKS")) {
      explicitFollowSymlinks = true;
      g.RecurseThroughSymlinksOn();
      ++i;
      if (i == args.end()) {
        this->SetError(
          "GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS");
        return false;
      }
    }

    if (*i == "RELATIVE") {
      ++i; // skip RELATIVE
      if (i == args.end()) {
        this->SetError("GLOB requires a directory after the RELATIVE tag");
        return false;
      }
      g.SetRelative(i->c_str());
      ++i;
      if (i == args.end()) {
        this->SetError("GLOB requires a glob expression after the directory");
        return false;
      }
    }

    cmsys::Glob::GlobMessages globMessages;
    if (!cmsys::SystemTools::FileIsFullPath(i->c_str())) {
      std::string expr = this->Makefile->GetCurrentSourceDirectory();
      // Handle script mode
      if (!expr.empty()) {
        expr += "/" + *i;
        g.FindFiles(expr, &globMessages);
      } else {
        g.FindFiles(*i, &globMessages);
      }
    } else {
      g.FindFiles(*i, &globMessages);
    }

    if (!globMessages.empty()) {
      bool shouldExit = false;
      for (cmsys::Glob::GlobMessagesIterator it = globMessages.begin();
           it != globMessages.end(); ++it) {
        if (it->type == cmsys::Glob::cyclicRecursion) {
          this->Makefile->IssueMessage(
            cmake::AUTHOR_WARNING,
            "Cyclic recursion detected while globbing for '" + *i + "':\n" +
              it->content);
        } else {
          this->Makefile->IssueMessage(
            cmake::FATAL_ERROR, "Error has occurred while globbing for '" +
              *i + "' - " + it->content);
          shouldExit = true;
        }
      }
      if (shouldExit) {
        return false;
      }
    }

    std::vector<std::string>::size_type cc;
    std::vector<std::string>& files = g.GetFiles();
    std::sort(files.begin(), files.end());
    for (cc = 0; cc < files.size(); cc++) {
      if (!first) {
        output += ";";
      }
      output += files[cc];
      first = false;
    }
  }

  if (recurse && !explicitFollowSymlinks) {
    switch (status) {
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        // Correct behavior, yay!
        break;
      case cmPolicies::OLD:
      // Probably not really the expected behavior, but the author explicitly
      // asked for the old behavior... no warning.
      case cmPolicies::WARN:
        // Possibly unexpected old behavior *and* we actually traversed
        // symlinks without being explicitly asked to: warn the author.
        if (g.GetFollowedSymlinkCount() != 0) {
          this->Makefile->IssueMessage(
            cmake::AUTHOR_WARNING,
            cmPolicies::GetPolicyWarning(cmPolicies::CMP0009));
        }
        break;
    }
  }

  this->Makefile->AddDefinition(variable, output.c_str());
  return true;
}